

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O0

void __thiscall
kratos::SystemVerilogCodeGen::stmt_code(SystemVerilogCodeGen *this,LatchStmtBlock *stmt)

{
  allocator<char> local_39;
  string local_38;
  StmtBlock *local_18;
  LatchStmtBlock *stmt_local;
  SystemVerilogCodeGen *this_local;
  
  local_18 = &stmt->super_StmtBlock;
  stmt_local = (LatchStmtBlock *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"always_latch",&local_39);
  block_code(this,&local_38,local_18);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return;
}

Assistant:

void SystemVerilogCodeGen::stmt_code(LatchStmtBlock* stmt) { block_code("always_latch", stmt); }